

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall String::replace(String *this,String *needle,String *replacement)

{
  char *pcVar1;
  undefined1 local_60 [8];
  String result;
  char *match;
  char *p;
  String *replacement_local;
  String *needle_local;
  String *this_local;
  
  match = this->data->str;
  pcVar1 = operator_cast_to_char_(needle);
  result._data.ref = (usize)strstr(match,pcVar1);
  this_local = this;
  if ((char *)result._data.ref != (char *)0x0) {
    String((String *)local_60,this->data->len + replacement->data->len * 10);
    do {
      append((String *)local_60,match,result._data.ref - (long)match);
      append((String *)local_60,replacement);
      match = (char *)(result._data.ref + needle->data->len);
      pcVar1 = operator_cast_to_char_(needle);
      result._data.ref = (usize)strstr(match,pcVar1);
    } while ((char *)result._data.ref != (char *)0x0);
    append((String *)local_60,match,(usize)(this->data->str + (this->data->len - (long)match)));
    this_local = operator=(this,(String *)local_60);
    ~String((String *)local_60);
  }
  return this_local;
}

Assistant:

String& String::replace(const String& needle, const String& replacement)
{
  const char* p = data->str;
  const char* match = strstr(p, needle);
  if(!match)
    return *this;
  String result(data->len + replacement.data->len * 10);
  for(;;)
  {
    result.append(p, match - p);
    result.append(replacement);
    p = match + needle.data->len;
    match = strstr(p, needle);
    if(!match)
    {
      result.append(p, data->len - (p - data->str));
      return *this = result;
    }
  }
}